

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O3

void __thiscall OpenMD::UniformField::modifyForces(UniformField *this)

{
  double *pdVar1;
  Atom *pAVar2;
  AtomType *pAVar3;
  DataStoragePointer DVar4;
  Snapshot *pSVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint i_1;
  Molecule *pMVar9;
  long lVar10;
  uint i_2;
  long lVar11;
  uint i_3;
  long lVar12;
  pointer ppAVar13;
  double tmp;
  RealType RVar14;
  double dVar15;
  Vector<double,_3U> result;
  FluctuatingChargeAdapter fqa;
  MoleculeIterator i;
  Vector3d r;
  Vector<double,_3U> result_1;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  Vector3d t;
  double local_1a0;
  double local_198 [4];
  FluctuatingChargeAdapter local_178;
  MoleculeIterator local_170;
  Vector3d local_168;
  potVec local_148;
  RealType local_110;
  MultipoleAdapter local_108;
  FixedChargeAdapter local_100;
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  potVec local_68;
  
  if (this->initialized == false) {
    initialize(this);
  }
  local_170._M_node = (_Base_ptr)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_f8[2] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_168.super_Vector<double,_3U>.data_[2] = 0.0;
  local_168.super_Vector<double,_3U>.data_[0] = 0.0;
  local_168.super_Vector<double,_3U>.data_[1] = 0.0;
  if (this->doUniformField == true) {
    pMVar9 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&local_170);
    if (pMVar9 == (Molecule *)0x0) {
      local_1a0 = 0.0;
    }
    else {
      local_1a0 = 0.0;
      do {
        for (ppAVar13 = (pMVar9->atoms_).
                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            (ppAVar13 !=
             (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
             _M_impl.super__Vector_impl_data._M_finish &&
            (pAVar2 = *ppAVar13, pAVar2 != (Atom *)0x0)); ppAVar13 = ppAVar13 + 1) {
          pAVar3 = pAVar2->atomType_;
          lVar11 = (long)(pAVar2->super_StuntDouble).localIndex_;
          lVar10 = *(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar2->super_StuntDouble).storage_);
          pdVar1 = (double *)(lVar10 + lVar11 * 0x18);
          local_168.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_168.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_168.super_Vector<double,_3U>.data_[2] = *(double *)(lVar10 + 0x10 + lVar11 * 0x18);
          Snapshot::wrapVector
                    (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,&local_168);
          local_198[0] = 0.0;
          local_198[1] = 0.0;
          local_198[2] = 0.0;
          lVar10 = 0;
          do {
            local_198[lVar10] = (this->EF).super_Vector<double,_3U>.data_[lVar10] * 23.0609;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_148.data_[2] = local_198[2];
          local_148.data_[0] = local_198[0];
          local_148.data_[1] = local_198[1];
          lVar10 = (long)(pAVar2->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).electricField.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar2->super_StuntDouble).storage_);
          lVar11 = 0;
          do {
            *(double *)(lVar10 + lVar11 * 8) =
                 local_148.data_[lVar11] + *(double *)(lVar10 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          local_100.at_ = pAVar3;
          bVar8 = FixedChargeAdapter::isFixedCharge(&local_100);
          if (bVar8) {
            local_110 = FixedChargeAdapter::getCharge(&local_100);
            local_178.at_ = pAVar3;
            bVar8 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_178);
            dVar15 = local_110;
            RVar14 = local_110;
            if (bVar8) {
LAB_0014aefd:
              DVar4 = (pAVar2->super_StuntDouble).storage_;
              pSVar5 = ((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar10 = (long)(pAVar2->super_StuntDouble).localIndex_;
              dVar15 = *(double *)
                        (*(long *)((long)&(pSVar5->atomData).flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar4) +
                        lVar10 * 8);
              dVar6 = 0.0;
              lVar11 = 0;
              do {
                dVar6 = dVar6 + local_168.super_Vector<double,_3U>.data_[lVar11] *
                                (this->EF).super_Vector<double,_3U>.data_[lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              lVar11 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar4);
              *(double *)(lVar11 + lVar10 * 8) = dVar6 * 23.0609 + *(double *)(lVar11 + lVar10 * 8);
              dVar15 = RVar14 + dVar15;
            }
            local_198[0] = 0.0;
            local_198[1] = 0.0;
            local_198[2] = 0.0;
            lVar10 = 0;
            do {
              local_198[lVar10] = (this->EF).super_Vector<double,_3U>.data_[lVar10] * dVar15;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_148.data_[0] = 0.0;
            local_148.data_[1] = 0.0;
            local_148.data_[2] = 0.0;
            lVar10 = 0;
            do {
              local_148.data_[lVar10] = local_198[lVar10] * 23.0609;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_b8[2] = local_148.data_[2];
            local_b8[0] = local_148.data_[0];
            local_b8[1] = local_148.data_[1];
            DVar4 = (pAVar2->super_StuntDouble).storage_;
            pSVar5 = ((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar10 = (long)(pAVar2->super_StuntDouble).localIndex_;
            lVar11 = lVar10 * 0x18 +
                     *(long *)((long)&(pSVar5->atomData).force.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            lVar12 = 0;
            do {
              *(double *)(lVar11 + lVar12 * 8) = local_b8[lVar12] + *(double *)(lVar11 + lVar12 * 8)
              ;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            dVar15 = 0.0;
            lVar11 = 0;
            do {
              dVar15 = dVar15 + local_168.super_Vector<double,_3U>.data_[lVar11] * local_b8[lVar11];
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            if (this->doParticlePot == true) {
              lVar11 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar4);
              *(double *)(lVar11 + lVar10 * 8) = *(double *)(lVar11 + lVar10 * 8) - dVar15;
            }
            local_1a0 = local_1a0 - dVar15;
          }
          else {
            local_178.at_ = pAVar3;
            bVar8 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_178);
            RVar14 = 0.0;
            if (bVar8) goto LAB_0014aefd;
          }
          local_108.at_ = pAVar3;
          bVar8 = MultipoleAdapter::isDipole(&local_108);
          if (bVar8) {
            lVar11 = (long)(pAVar2->super_StuntDouble).localIndex_;
            lVar10 = *(long *)((long)&(((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).dipole.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar2->super_StuntDouble).storage_);
            local_198[2] = *(double *)(lVar10 + 0x10 + lVar11 * 0x18);
            pdVar1 = (double *)(lVar10 + lVar11 * 0x18);
            local_198[0] = *pdVar1;
            local_198[1] = pdVar1[1];
            local_148.data_[0] = 0.0;
            local_148.data_[1] = 0.0;
            local_148.data_[2] = 0.0;
            lVar10 = 0;
            do {
              local_148.data_[lVar10] = local_198[lVar10] * 4.8018969509;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            local_d8[2] = local_148.data_[2];
            local_d8[0] = local_148.data_[0];
            local_d8[1] = local_148.data_[1];
            dVar15 = (this->EF).super_Vector<double,_3U>.data_[0];
            dVar6 = (this->EF).super_Vector<double,_3U>.data_[1];
            dVar7 = (this->EF).super_Vector<double,_3U>.data_[2];
            local_f8[0] = dVar7 * local_148.data_[1] - local_148.data_[2] * dVar6;
            local_f8[1] = dVar15 * local_148.data_[2] - local_148.data_[0] * dVar7;
            local_f8[2] = local_148.data_[0] * dVar6 - dVar15 * local_148.data_[1];
            DVar4 = (pAVar2->super_StuntDouble).storage_;
            pSVar5 = ((pAVar2->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar10 = (long)(pAVar2->super_StuntDouble).localIndex_;
            lVar11 = lVar10 * 0x18 +
                     *(long *)((long)&(pSVar5->atomData).torque.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + DVar4);
            lVar12 = 0;
            do {
              *(double *)(lVar11 + lVar12 * 8) = local_f8[lVar12] + *(double *)(lVar11 + lVar12 * 8)
              ;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            dVar15 = 0.0;
            lVar11 = 0;
            do {
              dVar15 = dVar15 + local_d8[lVar11] * (this->EF).super_Vector<double,_3U>.data_[lVar11]
              ;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            if (this->doParticlePot == true) {
              lVar11 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar4);
              *(double *)(lVar11 + lVar10 * 8) = *(double *)(lVar11 + lVar10 * 8) - dVar15;
            }
            local_1a0 = local_1a0 - dVar15;
          }
        }
        pMVar9 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&local_170);
      } while (pMVar9 != (Molecule *)0x0);
    }
    pSVar5 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_148,pSVar5);
    local_78 = local_148.data_[0];
    dStack_70 = local_148.data_[1];
    local_88 = local_148.data_[5];
    dStack_80 = local_148.data_[6];
    local_98 = local_148.data_[3];
    dStack_90 = local_148.data_[4];
    local_68.data_[2] = local_1a0 + local_148.data_[2];
    local_68.data_[0] = local_148.data_[0];
    local_68.data_[1] = local_148.data_[1];
    local_68.data_[3] = local_148.data_[3];
    local_68.data_[4] = local_148.data_[4];
    local_68.data_[5] = local_148.data_[5];
    local_68.data_[6] = local_148.data_[6];
    Snapshot::setLongRangePotentials(pSVar5,&local_68);
  }
  return;
}

Assistant:

void UniformField::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;
    Vector3d r;

    bool isCharge;

    if (doUniformField) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // ad-hoc choice of the origin for potential calculation and
          // fluctuating charge force:

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);
            U = -dot(r, f);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);

            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }